

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O1

int cfg_avlcmp_schemaentries(void *p1,void *p2)

{
  int iVar1;
  
  iVar1 = cfg_avlcmp_keys(*p1,*p2);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = cfg_avlcmp_keys(*(void **)((long)p1 + 8),*(void **)((long)p2 + 8));
  return iVar1;
}

Assistant:

int
cfg_avlcmp_schemaentries(const void *p1, const void *p2) {
  const struct cfg_schema_entry_key *key1, *key2;
  int result;

  key1 = p1;
  key2 = p2;

  result = cfg_avlcmp_keys(key1->type, key2->type);
  if (result != 0) {
    return result;
  }

  return cfg_avlcmp_keys(key1->entry, key2->entry);
}